

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearSpeed.cpp
# Opt level: O2

void __thiscall chrono::ChLinkMotorLinearSpeed::ChLinkMotorLinearSpeed(ChLinkMotorLinearSpeed *this)

{
  Scalar *pSVar1;
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> local_30;
  undefined8 local_20;
  
  ChLinkMotorLinear::ChLinkMotorLinear(&this->super_ChLinkMotorLinear);
  *(undefined ***)
   &(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
    super_ChLink.super_ChLinkBase.super_ChPhysicsItem = &PTR__ChLinkMotorLinearSpeed_0116b518;
  ChVariablesGeneric::ChVariablesGeneric(&this->variable,1);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                      &(this->variable).Mmass,0,0);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                      &(this->variable).inv_Mmass,0,0);
  *pSVar1 = 1.0;
  local_20 = 0x3ff0000000000000;
  std::make_shared<chrono::ChFunction_Const,double>((double *)&local_30);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_ChLinkMotorLinear).super_ChLinkMotor.m_func,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  *(undefined8 *)&(this->super_ChLinkMotorLinear).field_0x278 = 0;
  this->aux_dt = 0.0;
  this->aux_dtdt = 0.0;
  this->avoid_position_drift = true;
  return;
}

Assistant:

ChLinkMotorLinearSpeed::ChLinkMotorLinearSpeed() {
    variable.GetMass()(0, 0) = 1.0;
    variable.GetInvMass()(0, 0) = 1.0;

    m_func = chrono_types::make_shared<ChFunction_Const>(1.0);

    pos_offset = 0;

    aux_dt = 0;  // used for integrating speed, = pos
    aux_dtdt = 0;

    avoid_position_drift = true;
}